

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O1

bool dxil_spv::emit_annotate_node_handle(Impl *impl,CallInst *inst)

{
  pointer pNVar1;
  bool bVar2;
  Id id;
  ValueKind VVar3;
  Value *pVVar4;
  Instruction *value;
  ulong uVar5;
  LoggingCallback p_Var6;
  void *pvVar7;
  ulong uVar8;
  uint32_t node_meta_index;
  undefined8 local_1028;
  undefined5 uStack_1020;
  undefined3 uStack_101b;
  undefined5 uStack_1018;
  char acStack_1013 [4083];
  
  pVVar4 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
  bVar2 = value_is_dx_op_instrinsic(pVVar4,IndexNodeHandle);
  pVVar4 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
  if (bVar2) {
    id = Converter::Impl::get_id_for_value(impl,pVVar4,0);
LAB_0015102e:
    Converter::Impl::rewrite_value(impl,(Value *)inst,id);
    bVar2 = true;
  }
  else {
    bVar2 = value_is_dx_op_instrinsic(pVVar4,CreateNodeOutputHandle);
    if (bVar2) {
      pVVar4 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
      value = (Instruction *)LLVMBC::Internal::resolve_proxy(pVVar4);
      VVar3 = LLVMBC::Value::get_value_kind((Value *)value);
      if (VVar3 != Call) {
        p_Var6 = get_thread_log_callback();
        if (p_Var6 == (LoggingCallback)0x0) {
          emit_annotate_node_handle();
          std::terminate();
        }
        uStack_1018 = 0x6163206e69;
        builtin_strncpy(acStack_1013,"st<T>.\n",8);
        local_1028._0_1_ = 'I';
        local_1028._1_1_ = 'n';
        local_1028._2_1_ = 'v';
        local_1028._3_1_ = 'a';
        local_1028._4_1_ = 'l';
        local_1028._5_1_ = 'i';
        local_1028._6_1_ = 'd';
        local_1028._7_1_ = ' ';
        uStack_1020 = 0x2065707974;
        uStack_101b = 0x204449;
        pvVar7 = get_thread_log_callback_userdata();
        (*p_Var6)(pvVar7,Error,(char *)&local_1028);
        std::terminate();
      }
      local_1028 = (ulong)local_1028._4_4_ << 0x20;
      bVar2 = get_constant_operand(value,1,(uint32_t *)&local_1028);
      if (bVar2) {
        uVar5 = local_1028 & 0xffffffff;
        pNVar1 = (impl->node_outputs).
                 super__Vector_base<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = ((long)(impl->node_outputs).
                       super__Vector_base<dxil_spv::Converter::Impl::NodeOutputMeta,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::NodeOutputMeta>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 2) *
                -0x5555555555555555;
        if (uVar5 <= uVar8 && uVar8 - uVar5 != 0) {
          id = pNVar1[uVar5].spec_constant_node_index;
          goto LAB_0015102e;
        }
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool emit_annotate_node_handle(Converter::Impl &impl, const llvm::CallInst *inst)
{
	// Not sure why there are two separate opcodes for annotating a handle, but DXIL's gonna DXIL ...
	if (value_is_dx_op_instrinsic(inst->getOperand(1), DXIL::Op::IndexNodeHandle))
	{
		// Trivially forward the annotation.
		impl.rewrite_value(inst, impl.get_id_for_value(inst->getOperand(1)));
		return true;
	}

	if (!value_is_dx_op_instrinsic(inst->getOperand(1), DXIL::Op::CreateNodeOutputHandle))
		return false;

	auto *node_output = llvm::cast<llvm::CallInst>(inst->getOperand(1));
	uint32_t node_meta_index = 0;
	if (!get_constant_operand(node_output, 1, &node_meta_index))
		return false;

	if (node_meta_index >= impl.node_outputs.size())
		return false;

	auto &node_meta = impl.node_outputs[node_meta_index];
	impl.rewrite_value(inst, node_meta.spec_constant_node_index);
	return true;
}